

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.hpp
# Opt level: O0

back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> __thiscall
pstore::diff_details::
traverser<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
::
visit_intermediate<pstore::index::details::internal_node,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
          (traverser<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
           *this,index_pointer node,uint shifts,
          back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> out)

{
  internal_node *this_00;
  index_pointer node_00;
  bool bVar1;
  internal_node **ppiVar2;
  const_iterator piVar3;
  index_pointer child;
  const_iterator __end0;
  const_iterator __begin0;
  internal_node *__range3;
  pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
  local_60;
  undefined1 local_48 [8];
  pair<std::shared_ptr<const_void>,_const_pstore::index::details::internal_node_*> p;
  uint shifts_local;
  traverser<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_local;
  back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> out_local;
  index_pointer node_local;
  
  p.second._4_4_ = shifts;
  pstore::index::details::internal_node::get_node(&local_60,*(database **)this,node);
  std::pair<std::shared_ptr<const_void>,_const_pstore::index::details::internal_node_*>::
  pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*,_true>
            ((pair<std::shared_ptr<const_void>,_const_pstore::index::details::internal_node_*> *)
             local_48,&local_60);
  std::
  pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
  ::~pair(&local_60);
  ppiVar2 = std::get<pstore::index::details::internal_node_const*,std::shared_ptr<void_const>>
                      ((pair<std::shared_ptr<const_void>,_const_pstore::index::details::internal_node_*>
                        *)local_48);
  if (*ppiVar2 == (internal_node *)0x0) {
    assert_failed("std::get<Node const *> (p) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/diff.hpp"
                  ,0x7d);
  }
  ppiVar2 = std::get<pstore::index::details::internal_node_const*,std::shared_ptr<void_const>>
                      ((pair<std::shared_ptr<const_void>,_const_pstore::index::details::internal_node_*>
                        *)local_48);
  this_00 = *ppiVar2;
  __end0 = pstore::index::details::internal_node::begin(this_00);
  piVar3 = pstore::index::details::internal_node::end(this_00);
  this_local = (traverser<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)out.container;
  for (; __end0 != piVar3; __end0 = __end0 + 1) {
    node_00 = *__end0;
    bVar1 = traverser<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::is_new((traverser<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)this,node);
    if (bVar1) {
      this_local = (traverser<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)visit_node<std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                                (this,node_00,p.second._4_4_ + 6,
                                 (back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>
                                  )this_local);
    }
  }
  std::pair<std::shared_ptr<const_void>,_const_pstore::index::details::internal_node_*>::~pair
            ((pair<std::shared_ptr<const_void>,_const_pstore::index::details::internal_node_*> *)
             local_48);
  return (back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>)
         (vector<pstore::address,_std::allocator<pstore::address>_> *)this_local;
}

Assistant:

OutputIterator
        traverser<Index>::visit_intermediate (index::details::index_pointer const node,
                                              unsigned const shifts, OutputIterator out) const {
            std::pair<std::shared_ptr<void const>, Node const *> const p =
                Node::get_node (db_, node);
            PSTORE_ASSERT (std::get<Node const *> (p) != nullptr);
            for (auto child : *std::get<Node const *> (p)) {
                if (this->is_new (node)) {
                    out = this->visit_node (index_pointer{child},
                                            shifts + index::details::hash_index_bits, out);
                }
            }
            return out;
        }